

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

void __thiscall leveldb::VersionSet::Finalize(VersionSet *this,Version *v)

{
  long lVar1;
  pointer ppFVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long in_FS_OFFSET;
  double dVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  dVar10 = -1.0;
  uVar3 = 0xffffffff;
  iVar4 = 1;
  uVar5 = 0;
  do {
    if (uVar5 == 0) {
      lVar7 = (long)v->files_[0].
                    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)v->files_[0].
                    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar7 >> 3;
      auVar14._8_4_ = (int)(lVar7 >> 0x23);
      auVar14._0_8_ = lVar8;
      auVar14._12_4_ = 0x45300000;
      dVar11 = ((auVar14._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) * 0.25;
    }
    else {
      ppFVar2 = v->files_[uVar5].
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar7 = (long)v->files_[uVar5].
                    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar2;
      if (lVar7 == 0) {
        dVar11 = 0.0;
      }
      else {
        lVar7 = lVar7 >> 3;
        lVar9 = 0;
        lVar8 = 0;
        do {
          lVar8 = lVar8 + ppFVar2[lVar9]->file_size;
          lVar9 = lVar9 + 1;
        } while (lVar7 + (ulong)(lVar7 == 0) != lVar9);
        auVar13._8_4_ = (int)((ulong)lVar8 >> 0x20);
        auVar13._0_8_ = lVar8;
        auVar13._12_4_ = 0x45300000;
        dVar11 = (auVar13._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0);
      }
      dVar12 = 10485760.0;
      if (uVar5 != 1) {
        dVar12 = 10485760.0;
        iVar6 = iVar4;
        do {
          dVar12 = dVar12 * 10.0;
          iVar6 = iVar6 + -1;
        } while (2 < iVar6);
      }
      dVar11 = dVar11 / dVar12;
    }
    if (dVar10 < dVar11) {
      uVar3 = uVar5 & 0xffffffff;
      dVar10 = dVar11;
    }
    uVar5 = uVar5 + 1;
    iVar4 = iVar4 + 1;
  } while (uVar5 != 6);
  v->compaction_level_ = (int)uVar3;
  v->compaction_score_ = dVar10;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VersionSet::Finalize(Version* v) {
  // Precomputed best level for next compaction
  int best_level = -1;
  double best_score = -1;

  for (int level = 0; level < config::kNumLevels - 1; level++) {
    double score;
    if (level == 0) {
      // We treat level-0 specially by bounding the number of files
      // instead of number of bytes for two reasons:
      //
      // (1) With larger write-buffer sizes, it is nice not to do too
      // many level-0 compactions.
      //
      // (2) The files in level-0 are merged on every read and
      // therefore we wish to avoid too many files when the individual
      // file size is small (perhaps because of a small write-buffer
      // setting, or very high compression ratios, or lots of
      // overwrites/deletions).
      score = v->files_[level].size() /
              static_cast<double>(config::kL0_CompactionTrigger);
    } else {
      // Compute the ratio of current size to size limit.
      const uint64_t level_bytes = TotalFileSize(v->files_[level]);
      score =
          static_cast<double>(level_bytes) / MaxBytesForLevel(options_, level);
    }

    if (score > best_score) {
      best_level = level;
      best_score = score;
    }
  }

  v->compaction_level_ = best_level;
  v->compaction_score_ = best_score;
}